

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen11TextureCalc::GetMipTailByteOffset
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  if (((((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
        pGmmLibContext)->SkuTable).field_1.field_0x1 & 0x80) == 0) {
    uVar2 = GmmGen9TextureCalc::GetMipTailByteOffset((GmmGen9TextureCalc *)this,pTexInfo,MipLevel);
    return uVar2;
  }
  uVar2 = 0;
  switch(pTexInfo->Type) {
  case RESOURCE_1D:
  case RESOURCE_3D:
    uVar3 = (SUB84((pTexInfo->Flags).Info,4) >> 3 & 4) +
            (MipLevel - (pTexInfo->Alignment).MipTailStartLod);
    break;
  case RESOURCE_2D:
  case RESOURCE_CUBE:
    aVar1 = (pTexInfo->Flags).Info;
    if (((ulong)aVar1 >> 0x26 & 1) == 0) {
      if (((ulong)aVar1 >> 0x25 & 1) != 0) {
        uVar4 = (pTexInfo->MSAA).NumSamples - 2;
        uVar3 = uVar4 >> 1;
        uVar4 = uVar3 | (uint)((uVar4 & 1) != 0) << 0x1f;
        if ((uVar4 < 8) && ((0x8bU >> (uVar3 & 0x1f) & 1) != 0)) {
          uVar3 = *(uint *)(&DAT_001c8290 + (ulong)uVar4 * 4);
          goto LAB_001b3a23;
        }
      }
      uVar3 = aVar1._4_4_ >> 3 & 4;
    }
    else {
      uVar2 = (pTexInfo->MSAA).NumSamples;
      if (uVar2 == 4) {
        uVar3 = 2;
      }
      else if (uVar2 == 8) {
        uVar3 = 3;
      }
      else if (uVar2 == 0x10) {
        uVar3 = 4;
      }
      else {
        uVar3 = (uint)(uVar2 == 2);
      }
    }
LAB_001b3a23:
    uVar3 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + uVar3;
    break;
  default:
    goto switchD_001b399b_default;
  }
  uVar2 = 0;
  if (uVar3 < 0xf) {
    uVar2 = *(uint32_t *)(&DAT_001c8460 + (ulong)uVar3 * 4);
  }
switchD_001b399b_default:
  return uVar2;
}

Assistant:

uint32_t GmmLib::GmmGen11TextureCalc::GetMipTailByteOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                           uint32_t          MipLevel)
{
    uint32_t ByteOffset = 0, Slot = 0xff;

    GMM_DPF_ENTER;

    // 3D textures follow the Gen10 mip tail format
    if(!pGmmLibContext->GetSkuTable().FtrStandardMipTailFormat)
    {
        return GmmGen9TextureCalc::GetMipTailByteOffset(pTexInfo, MipLevel);
    }

    if((pTexInfo->Type == RESOURCE_1D) || (pTexInfo->Type == RESOURCE_3D))
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples == 16) ? 11:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  8) ? 10:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  4) ?  8:
                    (pTexInfo->Flags.Info.TiledYf && pTexInfo->MSAA.NumSamples ==  2) ?  5:
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on
    }

    switch(Slot)
    {
        case 0:
            ByteOffset = GMM_KBYTE(32);
            break;
        case 1:
            ByteOffset = GMM_KBYTE(16);
            break;
        case 2:
            ByteOffset = GMM_KBYTE(8);
            break;
        case 3:
            ByteOffset = GMM_KBYTE(4);
            break;
        case 4:
            ByteOffset = GMM_KBYTE(2);
            break;
        case 5:
            ByteOffset = GMM_BYTES(1536);
            break;
        case 6:
            ByteOffset = GMM_BYTES(1280);
            break;
        case 7:
            ByteOffset = GMM_BYTES(1024);
            break;
        case 8:
            ByteOffset = GMM_BYTES(768);
            break;
        case 9:
            ByteOffset = GMM_BYTES(512);
            break;
        case 10:
            ByteOffset = GMM_BYTES(256);
            break;
        case 11:
            ByteOffset = GMM_BYTES(0);
            break;
        case 12:
            ByteOffset = GMM_BYTES(64);
            break;
        case 13:
            ByteOffset = GMM_BYTES(128);
            break;
        case 14:
            ByteOffset = GMM_BYTES(196);
            break;
        default:
            __GMM_ASSERT(0);
    }

    GMM_DPF_EXIT;

    return (ByteOffset);
}